

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double find_split_std_gain_weighted<double,double>
                 (double *x,size_t n,double *sd_arr,GainCriterion criterion,double min_gain,
                 double *split_point,double *w,size_t *sorted_ix)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double cumw;
  double local_38;
  
  dVar5 = calc_sd_right_to_left_weighted<double,double>(x,n,sd_arr,w,&local_38,sorted_ix);
  if (n == 1) {
    lVar3 = 0;
    dVar10 = -INFINITY;
  }
  else {
    dVar10 = -INFINITY;
    dVar6 = 0.0;
    lVar4 = 0;
    lVar3 = 0;
    dVar7 = 0.0;
    dVar8 = 0.0;
    dVar9 = x[*sorted_ix];
    do {
      dVar1 = w[sorted_ix[lVar4]];
      dVar6 = dVar6 + dVar1;
      dVar2 = x[sorted_ix[lVar4]];
      dVar7 = ((dVar2 - dVar7) * dVar1) / dVar6 + dVar7;
      dVar8 = (dVar2 - dVar9) * (dVar2 - dVar7) * dVar1 + dVar8;
      if ((dVar2 != x[sorted_ix[lVar4 + 1]]) || (NAN(dVar2) || NAN(x[sorted_ix[lVar4 + 1]]))) {
        dVar9 = 0.0;
        if (lVar4 != 0) {
          dVar9 = SQRT(dVar8 / dVar6);
        }
        if (criterion == Pooled) {
          dVar9 = ((dVar6 / local_38) * dVar9 + ((local_38 - dVar6) / local_38) * sd_arr[lVar4 + 1])
                  * (-1.0 / dVar5) + 1.0;
        }
        else {
          dVar9 = 1.0 - (dVar9 + sd_arr[lVar4 + 1]) / (dVar5 + dVar5);
        }
        if ((dVar10 < dVar9) && (min_gain < dVar9)) {
          lVar3 = lVar4;
          dVar10 = dVar9;
        }
      }
      lVar4 = lVar4 + 1;
      dVar9 = dVar7;
    } while (n - 1 != lVar4);
  }
  if (dVar10 != -INFINITY) {
    dVar5 = x[sorted_ix[lVar3]];
    dVar9 = x[sorted_ix[lVar3 + 1]];
    dVar6 = (dVar9 - dVar5) * 0.5 + dVar5;
    if ((dVar9 <= dVar6) && ((dVar6 = nextafter(dVar6,dVar9), dVar6 <= dVar5 || (dVar9 <= dVar6))))
    {
      dVar6 = dVar5;
    }
    *split_point = dVar6;
  }
  return dVar10;
}

Assistant:

double find_split_std_gain_weighted(real_t *restrict x, size_t n, double *restrict sd_arr,
                                    GainCriterion criterion, double min_gain, double &restrict split_point,
                                    double *restrict w, size_t *restrict sorted_ix)
{
    ldouble_safe cumw;
    double full_sd = calc_sd_right_to_left_weighted(x, n, sd_arr, w, cumw, sorted_ix);
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    ldouble_safe mean_prev = x[sorted_ix[0]];
    double best_gain = -HUGE_VAL;
    double this_sd, this_gain;
    double w_this;
    ldouble_safe currw = 0;
    size_t best_ix = 0;

    for (size_t row = 0; row < n-1; row++)
    {
        w_this = w[sorted_ix[row]];
        currw += w_this;
        running_mean   += w_this * (x[sorted_ix[row]] - running_mean) / currw;
        running_ssq    += w_this * ((x[sorted_ix[row]] - running_mean) * (x[sorted_ix[row]] - mean_prev));
        mean_prev       =  running_mean;
        if (x[sorted_ix[row]] == x[sorted_ix[row+1]])
            continue;

        this_sd = (row == 0)? 0. : std::sqrt(running_ssq / currw);
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, cumw, this_sd, sd_arr[row+1], currw, cumw-currw)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            best_ix = row;
        }
    }

    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[sorted_ix[best_ix]], x[sorted_ix[best_ix+1]]);

    return best_gain;
}